

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

void Cba_BlastFullAdder(Gia_Man_t *pNew,int a,int b,int c,int *pc,int *ps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iLit0;
  int And2_;
  int And2_1;
  int Xor_1;
  int And1_;
  int And1_1;
  int And2;
  int And1;
  int Xor;
  int fUseXor;
  int *ps_local;
  int *pc_local;
  int c_local;
  int b_local;
  int a_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ManHashAnd(pNew,a,b);
  iVar2 = Abc_LitNot(a);
  iVar3 = Abc_LitNot(b);
  iVar2 = Gia_ManHashAnd(pNew,iVar2,iVar3);
  iVar2 = Gia_ManHashOr(pNew,iVar1,iVar2);
  iVar2 = Abc_LitNot(iVar2);
  iVar3 = Gia_ManHashAnd(pNew,c,iVar2);
  iLit0 = Abc_LitNot(c);
  iVar2 = Abc_LitNot(iVar2);
  iVar2 = Gia_ManHashAnd(pNew,iLit0,iVar2);
  iVar2 = Gia_ManHashOr(pNew,iVar3,iVar2);
  iVar2 = Abc_LitNot(iVar2);
  *ps = iVar2;
  iVar1 = Gia_ManHashOr(pNew,iVar1,iVar3);
  *pc = iVar1;
  return;
}

Assistant:

void Cba_BlastFullAdder( Gia_Man_t * pNew, int a, int b, int c, int * pc, int * ps )
{
    int fUseXor = 0;
    if ( fUseXor )
    {
        int Xor  = Gia_ManHashXor(pNew, a, b);
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        *ps      = Gia_ManHashXor(pNew, c, Xor);
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
    else
    {
        int And1 = Gia_ManHashAnd(pNew, a, b);
        int And1_= Gia_ManHashAnd(pNew, Abc_LitNot(a), Abc_LitNot(b));
        int Xor  = Abc_LitNot(Gia_ManHashOr(pNew, And1, And1_));
        int And2 = Gia_ManHashAnd(pNew, c, Xor);
        int And2_= Gia_ManHashAnd(pNew, Abc_LitNot(c), Abc_LitNot(Xor));
        *ps      = Abc_LitNot(Gia_ManHashOr(pNew, And2, And2_));
        *pc      = Gia_ManHashOr (pNew, And1, And2);
    }
}